

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

var cs::invoke<cs_impl::any_const&,cs_impl::any_const&>(var *func,any *_args,any *_args_1)

{
  initializer_list<cs_impl::any> __l;
  initializer_list<cs_impl::any> __l_00;
  bool bVar1;
  runtime_error *this;
  proxy *in_RDI;
  vector args_1;
  object_method *om;
  vector args;
  string *in_stack_fffffffffffffe48;
  vector *in_stack_fffffffffffffe50;
  callable *in_stack_fffffffffffffe58;
  allocator *paVar2;
  type_info *in_stack_fffffffffffffe60;
  allocator_type *in_stack_fffffffffffffe78;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_stack_fffffffffffffe80;
  iterator in_stack_fffffffffffffe88;
  size_type in_stack_fffffffffffffe90;
  undefined1 **local_160;
  any *in_stack_fffffffffffffed0;
  undefined1 **local_110;
  allocator local_e9;
  string local_e8 [40];
  undefined8 *local_c0;
  undefined1 *local_b8;
  undefined1 local_b0 [8];
  undefined1 local_a8 [8];
  undefined8 *local_a0;
  undefined8 local_98;
  object_method *local_78;
  undefined8 *local_60;
  undefined1 *local_58;
  undefined1 local_50 [8];
  undefined8 *local_48;
  undefined8 local_40;
  
  cs_impl::any::type((any *)in_stack_fffffffffffffe50);
  bVar1 = std::type_info::operator==
                    (in_stack_fffffffffffffe60,(type_info *)in_stack_fffffffffffffe58);
  if (bVar1) {
    local_60 = &local_58;
    cs_impl::any::any((any *)in_stack_fffffffffffffe50,(any *)in_stack_fffffffffffffe48);
    local_60 = (undefined8 *)local_50;
    cs_impl::any::any((any *)in_stack_fffffffffffffe50,(any *)in_stack_fffffffffffffe48);
    local_48 = &local_58;
    local_40 = 2;
    std::allocator<cs_impl::any>::allocator((allocator<cs_impl::any> *)0x4554be);
    __l._M_len = in_stack_fffffffffffffe90;
    __l._M_array = in_stack_fffffffffffffe88;
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
              (in_stack_fffffffffffffe80,__l,in_stack_fffffffffffffe78);
    std::allocator<cs_impl::any>::~allocator((allocator<cs_impl::any> *)0x4554f2);
    local_110 = (undefined1 **)&local_48;
    do {
      local_110 = local_110 + -1;
      cs_impl::any::~any((any *)0x455527);
    } while (local_110 != &local_58);
    cs_impl::any::const_val<cs::callable>(in_stack_fffffffffffffed0);
    callable::call(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector
              ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffe60);
  }
  else {
    cs_impl::any::type((any *)in_stack_fffffffffffffe50);
    bVar1 = std::type_info::operator==
                      (in_stack_fffffffffffffe60,(type_info *)in_stack_fffffffffffffe58);
    if (!bVar1) {
      this = (runtime_error *)__cxa_allocate_exception(0x28);
      paVar2 = &local_e9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8,"Invoke non-callable object.",paVar2);
      runtime_error::runtime_error(this,in_stack_fffffffffffffe48);
      __cxa_throw(this,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    local_78 = cs_impl::any::const_val<cs::object_method>(in_stack_fffffffffffffed0);
    local_c0 = &local_b8;
    cs_impl::any::any((any *)in_stack_fffffffffffffe50,(any *)in_stack_fffffffffffffe48);
    local_c0 = (undefined8 *)local_b0;
    cs_impl::any::any((any *)in_stack_fffffffffffffe50,(any *)in_stack_fffffffffffffe48);
    local_c0 = (undefined8 *)local_a8;
    cs_impl::any::any((any *)in_stack_fffffffffffffe50,(any *)in_stack_fffffffffffffe48);
    local_a0 = &local_b8;
    local_98 = 3;
    std::allocator<cs_impl::any>::allocator((allocator<cs_impl::any> *)0x455746);
    __l_00._M_len = in_stack_fffffffffffffe90;
    __l_00._M_array = in_stack_fffffffffffffe88;
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
              (in_stack_fffffffffffffe80,__l_00,in_stack_fffffffffffffe78);
    std::allocator<cs_impl::any>::~allocator((allocator<cs_impl::any> *)0x455777);
    local_160 = (undefined1 **)&local_a0;
    do {
      local_160 = local_160 + -1;
      cs_impl::any::~any((any *)0x4557a0);
    } while (local_160 != &local_b8);
    cs_impl::any::const_val<cs::callable>(in_stack_fffffffffffffed0);
    callable::call(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector
              ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffe60);
  }
  return (var)in_RDI;
}

Assistant:

static var invoke(const var &func, ArgsT &&... _args)
	{
		if (func.type() == typeid(callable)) {
			vector args{std::forward<ArgsT>(_args)...};
			return func.const_val<callable>().call(args);
		}
		else if (func.type() == typeid(object_method)) {
			const auto &om = func.const_val<object_method>();
			vector args{om.object, std::forward<ArgsT>(_args)...};
			return om.callable.const_val<callable>().call(args);
		}
		else
			throw runtime_error("Invoke non-callable object.");
	}